

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void label_cb(Fl_Input *i,void *v)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  Fl_Type *this;
  char *__s;
  
  if ((char *)v == "LOAD") {
    Fl_Input_::static_value(&i->super_Fl_Input_,(current_widget->super_Fl_Type).label_);
    __s = (i->super_Fl_Input_).value_;
    sVar2 = strlen(__s);
    if (oldlabellen <= sVar2) {
      oldlabellen = (int)sVar2 + 0x80;
      oldlabel = (char *)realloc(oldlabel,(ulong)oldlabellen);
      __s = (i->super_Fl_Input_).value_;
    }
    strcpy(oldlabel,__s);
    return;
  }
  if (Fl_Type::first != (Fl_Type *)0x0) {
    bVar3 = true;
    this = Fl_Type::first;
    do {
      while ((this->selected != '\0' && (iVar1 = (*this->_vptr_Fl_Type[0x17])(this), iVar1 != 0))) {
        Fl_Type::label(this,(i->super_Fl_Input_).value_);
        this = this->next;
        bVar3 = false;
        if (this == (Fl_Type *)0x0) goto LAB_00183335;
      }
      this = this->next;
    } while (this != (Fl_Type *)0x0);
    if (!bVar3) {
LAB_00183335:
      set_modflag(1);
      return;
    }
  }
  return;
}

Assistant:

void label_cb(Fl_Input* i, void *v) {
  if (v == LOAD) {
    i->static_value(current_widget->label());
    if (strlen(i->value()) >= oldlabellen) {
      oldlabellen = strlen(i->value())+128;
      oldlabel = (char*)realloc(oldlabel,oldlabellen);
    }
    strcpy(oldlabel,i->value());
  } else {
    int mod = 0;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
        o->label(i->value());
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
}